

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_open(lua_State *L)

{
  char *__filename;
  char *__modes;
  FILE **ppFVar1;
  FILE *pFVar2;
  int local_2c;
  FILE **pf;
  char *mode;
  char *filename;
  lua_State *L_local;
  
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
  ppFVar1 = newfile(L);
  pFVar2 = fopen(__filename,__modes);
  *ppFVar1 = (FILE *)pFVar2;
  if (*ppFVar1 == (FILE *)0x0) {
    local_2c = pushresult(L,0,__filename);
  }
  else {
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

static int io_open (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  FILE **pf = newfile(L);
  *pf = fopen(filename, mode);
  return (*pf == NULL) ? pushresult(L, 0, filename) : 1;
}